

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O0

int __thiscall
GEO::geofile::rotate_data
          (geofile *this,double *o_x,double *o_y,double *o_z,double *theta_x,double *theta_y,
          double *theta_z)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_50;
  iterator i;
  iterator pm_end;
  double *theta_y_local;
  double *theta_x_local;
  double *o_z_local;
  double *o_y_local;
  double *o_x_local;
  geofile *this_local;
  
  pm_end._M_node._7_1_ = 1;
  make_coherent(this,(bool *)((long)&pm_end._M_node + 7));
  simplify_data(this);
  i = std::map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
      ::end(&this->points_map);
  local_50._M_node =
       (_Base_ptr)
       std::map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
       ::begin(&this->points_map);
  while( true ) {
    bVar1 = std::operator!=(&local_50,&i);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>::operator->(&local_50);
    rotate_point(this,o_x,o_y,o_z,theta_x,theta_y,theta_z,&ppVar2->second);
    std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>::operator++(&local_50,0);
  }
  return 0;
}

Assistant:

int GEO::geofile::rotate_data( const double &o_x,      const double &o_y,
                                const double &o_z,      const double &theta_x,
                                const double &theta_y,  const double &theta_z)
{
    make_coherent(true);
    simplify_data();
    auto pm_end = points_map.end();
    for (auto i = points_map.begin(); i != pm_end; i++)
    {
        rotate_point(o_x,o_y,o_z,theta_x,theta_y,theta_z,i->second);
    }
    return EXIT_SUCCESS;
}